

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::weakly_canonical(path *p)

{
  bool bVar1;
  undefined8 uVar2;
  error_code *in_RDI;
  path *in_stack_00000010;
  string *in_stack_00000018;
  filesystem_error *in_stack_00000020;
  error_code in_stack_00000028;
  error_code ec;
  path *result;
  error_code *in_stack_00000100;
  path *in_stack_00000108;
  int in_stack_000001cc;
  error_code local_20 [2];
  
  std::error_code::error_code(in_RDI);
  weakly_canonical(in_stack_00000108,in_stack_00000100);
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x90);
    std::error_code::value(local_20);
    detail::systemErrorText<int>(in_stack_000001cc);
    filesystem_error::filesystem_error
              (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000028);
    __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
  }
  return (path *)in_RDI;
}

Assistant:

GHC_INLINE path weakly_canonical(const path& p)
{
    std::error_code ec;
    auto result = weakly_canonical(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}